

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O3

void __thiscall kj::Thread::ThreadState::ThreadState(ThreadState *this,Function<void_()> *func)

{
  Iface *pIVar1;
  ExceptionCallback *pEVar2;
  
  pIVar1 = (func->impl).ptr;
  (this->func).impl.disposer = (func->impl).disposer;
  (this->func).impl.ptr = pIVar1;
  (func->impl).ptr = (Iface *)0x0;
  pEVar2 = getExceptionCallback();
  (*pEVar2->_vptr_ExceptionCallback[6])(&this->initializer,pEVar2);
  (this->exception).ptr.isSet = false;
  this->refcount = 2;
  return;
}

Assistant:

Thread::ThreadState::ThreadState(Function<void()> func)
    : func(kj::mv(func)),
      initializer(getExceptionCallback().getThreadInitializer()),
      exception(kj::none),
      refcount(2) {}